

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

void set_signals(sig_t handler)

{
  __sighandler_t in_RDI;
  
  signal(6,in_RDI);
  signal(4,in_RDI);
  signal(0xb,in_RDI);
  signal(8,in_RDI);
  signal(7,in_RDI);
  signal(0xd,in_RDI);
  return;
}

Assistant:

static inline void set_signals(sig_t handler) {
    signal(SIGABRT, handler);
    signal(SIGILL, handler);
    signal(SIGSEGV, handler);
    signal(SIGFPE, handler);
    signal(SIGBUS, handler);
    signal(SIGPIPE, handler);
}